

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
FastVector<x86Instruction,_true,_true>::grow
          (FastVector<x86Instruction,_true,_true> *this,uint newSize)

{
  x86Instruction *ptr;
  
  ptr = this->data;
  grow_no_destroy(this,newSize);
  if (ptr != (x86Instruction *)0x0) {
    NULLC::alignedDealloc(ptr);
    return;
  }
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}